

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O2

void __thiscall VertexAttrib64Bit::LimitTest::deinit(LimitTest *this)

{
  glDisableFunc p_Var1;
  
  p_Var1 = (this->super_Base).gl.disable;
  if (p_Var1 != (glDisableFunc)0x0) {
    (*p_Var1)(0x8c89);
  }
  if (this->m_element_array_buffer_id != 0) {
    (*(this->super_Base).gl.bindBuffer)(0x8893,0);
    (*(this->super_Base).gl.deleteBuffers)(1,&this->m_element_array_buffer_id);
    this->m_element_array_buffer_id = 0;
  }
  if (this->m_transoform_feedback_buffer_id != 0) {
    (*(this->super_Base).gl.bindBuffer)(0x8c8e,0);
    (*(this->super_Base).gl.deleteBuffers)(1,&this->m_transoform_feedback_buffer_id);
    this->m_transoform_feedback_buffer_id = 0;
  }
  if (this->m_vertex_array_buffer_id != 0) {
    (*(this->super_Base).gl.bindBuffer)(0x8892,0);
    (*(this->super_Base).gl.deleteBuffers)(1,&this->m_vertex_array_buffer_id);
    this->m_vertex_array_buffer_id = 0;
  }
  if (this->m_vertex_array_object_id != 0) {
    (*(this->super_Base).gl.bindVertexArray)(0);
    (*(this->super_Base).gl.deleteVertexArrays)(1,&this->m_vertex_array_object_id);
    this->m_vertex_array_object_id = 0;
  }
  return;
}

Assistant:

void LimitTest::deinit()
{
	/* Restore default settings */
	if (0 != gl.disable)
	{
		gl.disable(GL_RASTERIZER_DISCARD);
	}

	/* Delete GL objects */
	if (0 != m_element_array_buffer_id)
	{
		gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);
		gl.deleteBuffers(1, &m_element_array_buffer_id);
		m_element_array_buffer_id = 0;
	}

	if (0 != m_transoform_feedback_buffer_id)
	{
		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, 0);
		gl.deleteBuffers(1, &m_transoform_feedback_buffer_id);
		m_transoform_feedback_buffer_id = 0;
	}

	if (0 != m_vertex_array_buffer_id)
	{
		gl.bindBuffer(GL_ARRAY_BUFFER, 0);
		gl.deleteBuffers(1, &m_vertex_array_buffer_id);
		m_vertex_array_buffer_id = 0;
	}

	if (0 != m_vertex_array_object_id)
	{
		gl.bindVertexArray(0);
		gl.deleteVertexArrays(1, &m_vertex_array_object_id);
		m_vertex_array_object_id = 0;
	}
}